

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

int raviX_bitset_iterator_next(BitSetIterator *iter,size_t *nbit)

{
  ulong uVar1;
  bitset_el_t *pbVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = iter->nbit;
  uVar3 = uVar4 >> 6;
  uVar1 = iter->bitset->els_num;
  pbVar2 = iter->bitset->varr;
  do {
    if (uVar1 <= uVar3) {
      return 0;
    }
    uVar5 = pbVar2[uVar3];
    if (uVar5 != 0) {
      for (uVar5 = uVar5 >> ((byte)uVar4 & 0x3f); uVar5 != 0; uVar5 = uVar5 >> 1) {
        if ((uVar5 & 1) != 0) {
          iter->nbit = uVar4 + 1;
          *nbit = uVar4;
          return 1;
        }
        uVar4 = uVar4 + 1;
        iter->nbit = uVar4;
      }
    }
    uVar3 = uVar3 + 1;
    uVar4 = uVar3 * 0x40;
    iter->nbit = uVar4;
  } while( true );
}

Assistant:

int raviX_bitset_iterator_next(BitSetIterator *iter, size_t *nbit) {
	const size_t el_bits_num = sizeof (bitset_el_t) * CHAR_BIT;
	size_t curr_nel = iter->nbit / el_bits_num, len = iter->bitset->els_num;
	bitset_el_t el, *addr = iter->bitset->varr;

	for (; curr_nel < len; curr_nel++, iter->nbit = curr_nel * el_bits_num)
		if ((el = addr[curr_nel]) != 0)
			for (el >>= iter->nbit % el_bits_num; el != 0; el >>= 1, iter->nbit++)
				if (el & 1) {
					*nbit = iter->nbit++;
					return true;
				}
	return false;
}